

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_PanAndZoomWidget.cpp
# Opt level: O0

void PanAndZoomWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  int *result;
  PanAndZoomWidget *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      onScaleUpdated((PanAndZoomWidget *)_o,*_a[1]);
    }
    else if (_id == 1) {
      onTranslationUpdated((PanAndZoomWidget *)_o,*(QPointF *)_a[1]);
    }
    else if (_id == 2) {
      onRotationUpdated((PanAndZoomWidget *)_o,*_a[1]);
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == onScaleUpdated && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == onTranslationUpdated &&
          (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == onRotationUpdated &&
            (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
      }
    }
  }
  return;
}

Assistant:

void PanAndZoomWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PanAndZoomWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->onScaleUpdated((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->onTranslationUpdated((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 2: _t->onRotationUpdated((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PanAndZoomWidget::*)(qreal );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PanAndZoomWidget::onScaleUpdated)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (PanAndZoomWidget::*)(QPointF );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PanAndZoomWidget::onTranslationUpdated)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (PanAndZoomWidget::*)(qreal );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PanAndZoomWidget::onRotationUpdated)) {
                *result = 2;
                return;
            }
        }
    }
}